

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsTypesX.hpp
# Opt level: O3

GraphicsPipelineStateCreateInfoX * __thiscall
Diligent::GraphicsPipelineStateCreateInfoX::Clear(GraphicsPipelineStateCreateInfoX *this)

{
  GraphicsPipelineStateCreateInfoX CleanDesc;
  GraphicsPipelineStateCreateInfoX __tmp;
  GraphicsPipelineStateCreateInfoX GStack_598;
  GraphicsPipelineStateCreateInfoX local_2e0;
  
  PipelineStateCreateInfoX<Diligent::GraphicsPipelineStateCreateInfoX,_Diligent::GraphicsPipelineStateCreateInfo>
  ::PipelineStateCreateInfoX
            (&GStack_598.
              super_PipelineStateCreateInfoX<Diligent::GraphicsPipelineStateCreateInfoX,_Diligent::GraphicsPipelineStateCreateInfo>
            );
  GStack_598.InputLayout.Desc.LayoutElements = (LayoutElement *)0x0;
  GStack_598.InputLayout.Desc.NumElements = 0;
  GStack_598.InputLayout.Elements.
  super__Vector_base<Diligent::LayoutElement,_std::allocator<Diligent::LayoutElement>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  GStack_598.InputLayout.Elements.
  super__Vector_base<Diligent::LayoutElement,_std::allocator<Diligent::LayoutElement>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  GStack_598.InputLayout.Elements.
  super__Vector_base<Diligent::LayoutElement,_std::allocator<Diligent::LayoutElement>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GStack_598.InputLayout.StringPool._M_h._M_buckets =
       &GStack_598.InputLayout.StringPool._M_h._M_single_bucket;
  GStack_598.InputLayout.StringPool._M_h._M_bucket_count = 1;
  GStack_598.InputLayout.StringPool._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  GStack_598.InputLayout.StringPool._M_h._M_element_count = 0;
  GStack_598.InputLayout.StringPool._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  GStack_598.InputLayout.StringPool._M_h._M_rehash_policy._M_next_resize = 0;
  GStack_598.InputLayout.StringPool._M_h._M_single_bucket = (__node_base_ptr)0x0;
  GraphicsPipelineStateCreateInfoX(&local_2e0,this);
  PipelineStateCreateInfoX<Diligent::GraphicsPipelineStateCreateInfoX,_Diligent::GraphicsPipelineStateCreateInfo>
  ::operator=(&this->
               super_PipelineStateCreateInfoX<Diligent::GraphicsPipelineStateCreateInfoX,_Diligent::GraphicsPipelineStateCreateInfo>
              ,&GStack_598.
                super_PipelineStateCreateInfoX<Diligent::GraphicsPipelineStateCreateInfoX,_Diligent::GraphicsPipelineStateCreateInfo>
             );
  InputLayoutDescX::operator=(&this->InputLayout,&GStack_598.InputLayout);
  PipelineStateCreateInfoX<Diligent::GraphicsPipelineStateCreateInfoX,_Diligent::GraphicsPipelineStateCreateInfo>
  ::operator=(&GStack_598.
               super_PipelineStateCreateInfoX<Diligent::GraphicsPipelineStateCreateInfoX,_Diligent::GraphicsPipelineStateCreateInfo>
              ,&local_2e0.
                super_PipelineStateCreateInfoX<Diligent::GraphicsPipelineStateCreateInfoX,_Diligent::GraphicsPipelineStateCreateInfo>
             );
  InputLayoutDescX::operator=(&GStack_598.InputLayout,&local_2e0.InputLayout);
  ~GraphicsPipelineStateCreateInfoX(&local_2e0);
  ~GraphicsPipelineStateCreateInfoX(&GStack_598);
  return this;
}

Assistant:

GraphicsPipelineStateCreateInfoX& Clear()
    {
        GraphicsPipelineStateCreateInfoX CleanDesc;
        std::swap(*this, CleanDesc);
        return *this;
    }